

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cpp
# Opt level: O2

bool nivalis::detail::has_var_ast(AST *ast,uint32_t addr)

{
  pointer pAVar1;
  ulong uVar2;
  anon_union_8_3_343d95dd_for_ASTNode_1 *paVar3;
  ulong uVar4;
  
  pAVar1 = (ast->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar2 = (long)(ast->
                super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>)
                ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar1 >> 4;
  uVar4 = 0;
  for (paVar3 = &pAVar1->field_1;
      (uVar2 != uVar4 &&
      (((0x12 < ((ASTNode *)(paVar3 + -1))->opcode ||
        ((0x60004U >> (((ASTNode *)(paVar3 + -1))->opcode & 0x1f) & 1) == 0)) ||
       (paVar3->ref != (ulong)addr)))); paVar3 = paVar3 + 2) {
    uVar4 = uVar4 + 1;
  }
  return uVar4 < uVar2;
}

Assistant:

bool has_var_ast(const Expr::AST& ast, uint32_t addr) {
    for (size_t i = 0; i < ast.size(); ++i) {
        if (OpCode::has_ref(ast[i].opcode) &&
            ast[i].opcode != OpCode::arg &&
            ast[i].ref == addr) {
            return true;
        }
    }
    return false;
}